

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewSymbolTreeVisitor.cpp
# Opt level: O0

void __thiscall NewSymbolTreeVisitor::Visit(NewSymbolTreeVisitor *this,Formals *formals)

{
  NewScopeLayer *pNVar1;
  Type *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  runtime_error *this_00;
  char *pcVar4;
  mapped_type *pmVar5;
  string local_158;
  Symbol local_138;
  char *local_118;
  char *local_110;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  string local_f0 [8];
  string new_type_name;
  Symbol local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  string *type_name;
  string local_78;
  Symbol local_58;
  reference local_38;
  pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *formal;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  Formals *formals_local;
  NewSymbolTreeVisitor *this_local;
  
  __end1 = std::
           vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&formals->formals_);
  formal = (pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(&formals->formals_);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)&formal);
    if (!bVar3) {
      return;
    }
    local_38 = __gnu_cxx::
               __normal_iterator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*(&__end1);
    pNVar1 = this->current_layer_;
    type = local_38->first;
    std::__cxx11::string::string((string *)&local_78,(string *)&local_38->second);
    Symbol::Symbol(&local_58,&local_78);
    NewScopeLayer::DeclareVariable(pNVar1,type,&local_58);
    Symbol::~Symbol(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    local_90 = &local_38->first->type_name_;
    bVar3 = std::operator==(local_90,"void");
    if (bVar3) break;
    bVar3 = std::operator!=(local_90,"int");
    if ((((bVar3) && (bVar3 = std::operator!=(local_90,"boolean"), bVar3)) &&
        (bVar3 = std::operator!=(local_90,"int[]"), bVar3)) &&
       (bVar3 = std::operator!=(local_90,"boolean[]"), bVar3)) {
      pcVar4 = (char *)std::__cxx11::string::back();
      pbVar2 = local_90;
      if (*pcVar4 == ']') {
        std::__cxx11::string::string(local_f0);
        local_f8._M_current = (char *)std::__cxx11::string::begin();
        local_108._M_current = (char *)std::__cxx11::string::end();
        local_100 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator-(&local_108,2);
        local_110 = (char *)std::__cxx11::string::begin();
        local_118 = (char *)std::
                            copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                                      (local_f8,local_100,
                                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        )local_110);
        pNVar1 = this->current_layer_;
        std::__cxx11::string::string((string *)&local_158,(string *)&local_38->second);
        Symbol::Symbol(&local_138,&local_158);
        pmVar5 = std::
                 unordered_map<Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&pNVar1->user_type_system_,&local_138);
        std::__cxx11::string::operator=((string *)pmVar5,local_f0);
        Symbol::~Symbol(&local_138);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string(local_f0);
      }
      else {
        pNVar1 = this->current_layer_;
        std::__cxx11::string::string
                  ((string *)(new_type_name.field_2._M_local_buf + 8),(string *)&local_38->second);
        Symbol::Symbol(&local_b0,(string *)(new_type_name.field_2._M_local_buf + 8));
        pmVar5 = std::
                 unordered_map<Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&pNVar1->user_type_system_,&local_b0);
        std::__cxx11::string::operator=((string *)pmVar5,(string *)pbVar2);
        Symbol::~Symbol(&local_b0);
        std::__cxx11::string::~string((string *)(new_type_name.field_2._M_local_buf + 8));
      }
    }
    __gnu_cxx::
    __normal_iterator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Can\'t declare variable of void type");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void NewSymbolTreeVisitor::Visit(Formals* formals) {
  for (auto& formal : formals->formals_) {
    current_layer_->DeclareVariable(formal.first, Symbol(formal.second));

    const std::string& type_name = formal.first->type_name_;

    if (type_name == "void") {
      throw std::runtime_error("Can't declare variable of void type");
    }

    // pre type checking to resolve class methods and fields
    if (type_name != "int" && type_name != "boolean" && type_name != "int[]" &&
        type_name != "boolean[]") {
      if (type_name.back() != ']') {
        current_layer_->user_type_system_[Symbol(formal.second)] = type_name;
      } else {
        std::string new_type_name;

        std::copy(type_name.begin(), type_name.end() - 2,
                  new_type_name.begin());

        current_layer_->user_type_system_[Symbol(formal.second)] =
            new_type_name;
      }
    }
  }
}